

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivVerify.cpp
# Opt level: O0

void DivVerifyInt64Int64_2(void)

{
  bool bVar1;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si2;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  bool fSuccess;
  TestCase<long,_long,_1> test;
  TestVector<long,_long,_1> tests;
  TestVector<long,_long,_1> *in_stack_ffffffffffffff60;
  long in_stack_ffffffffffffff70;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffff78;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_48;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_40;
  byte expected;
  long in_stack_ffffffffffffffd0;
  long in_stack_ffffffffffffffd8;
  byte in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe1;
  TestVector<long,_long,_1> local_18;
  
  TestVector<long,_long,_1>::TestVector(&local_18);
  TestVector<long,_long,_1>::GetNext(in_stack_ffffffffffffff60);
  while( true ) {
    bVar1 = TestVector<long,_long,_1>::Done(&local_18);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    expected = 1;
    SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
              (&local_40,(long *)&stack0xffffffffffffffd8);
    SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
              (&local_48);
    local_48 = operator/(in_stack_ffffffffffffff70,in_stack_ffffffffffffff78);
    if ((expected & 1) != (in_stack_ffffffffffffffe0 & 1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff78,"Error in case int64_int64 throw: ",
                 (allocator *)&stack0xffffffffffffff77);
      err_msg<long,long>((string *)CONCAT71(in_stack_ffffffffffffffe1,in_stack_ffffffffffffffe0),
                         in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,(bool)expected);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
    }
    TestVector<long,_long,_1>::GetNext(in_stack_ffffffffffffff60);
  }
  return;
}

Assistant:

void DivVerifyInt64Int64_2()
{
    TestVector< std::int64_t, std::int64_t, OpType::Div > tests;
    TestCase< std::int64_t, std::int64_t, OpType::Div > test = tests.GetNext();

    while (!tests.Done())
    {
      // Now test throwing version
      bool fSuccess = true;
      try
      {
         SafeInt<std::int64_t> si(test.y);
         SafeInt<std::int64_t> si2;

         si2 = test.x / si;
      }
      catch(...)
      {
         fSuccess = false;
      }

      if( fSuccess != test.fExpected )
      {
          err_msg( "Error in case int64_int64 throw: ", test.x, test.y, test.fExpected );
      }

      tests.GetNext();
   }
}